

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::SingleArena_CopyConstructEmpty_Test::~SingleArena_CopyConstructEmpty_Test
          (SingleArena_CopyConstructEmpty_Test *this)

{
  ~SingleArena_CopyConstructEmpty_Test
            ((SingleArena_CopyConstructEmpty_Test *)
             &this[-1].super_SingleArena.super_TestWithParam<bool>.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructEmpty) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "");
  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_FALSE(dst.IsDefault());
  } else {
    EXPECT_TRUE(dst.IsDefault());
  }
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}